

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

size_t ftxui::GlyphIterate(string *input,int glyph_offset,size_t start)

{
  bool bVar1;
  
  if (glyph_offset < 0) {
    for (; glyph_offset != 0; glyph_offset = glyph_offset + 1) {
      start = GlyphPrevious(input,start);
    }
  }
  else {
    while (bVar1 = glyph_offset != 0, glyph_offset = glyph_offset + -1, bVar1) {
      start = GlyphNext(input,start);
    }
  }
  return start;
}

Assistant:

size_t GlyphIterate(const std::string& input, int glyph_offset, size_t start) {
  if (glyph_offset >= 0) {
    for (int i = 0; i < glyph_offset; ++i) {
      start = GlyphNext(input, start);
    }
    return start;
  } else {
    for (int i = 0; i < -glyph_offset; ++i) {
      start = GlyphPrevious(input, start);
    }
    return start;
  }
}